

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket_acceptor.hpp
# Opt level: O1

int __thiscall
asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
          (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this,int __fd,int __n)

{
  int iVar1;
  error_code ec;
  
  std::_V2::system_category();
  iVar1 = asio::detail::reactive_socket_service_base::listen
                    ((reactive_socket_service_base *)
                     &((this->impl_).service_)->super_reactive_socket_service_base,(int)this + 8,
                     __fd);
  return iVar1;
}

Assistant:

void listen(int backlog = socket_base::max_listen_connections)
  {
    asio::error_code ec;
    impl_.get_service().listen(impl_.get_implementation(), backlog, ec);
    asio::detail::throw_error(ec, "listen");
  }